

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_recon.c
# Opt level: O3

void ihevc_chroma_recon_4x4
               (WORD16 *pi2_src,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 pred_strd,
               WORD32 dst_strd,WORD32 zero_cols)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  short *psVar7;
  
  iVar3 = 0;
  do {
    lVar6 = 4;
    pbVar4 = pu1_pred;
    pbVar5 = pu1_dst;
    psVar7 = pi2_src;
    if ((zero_cols & 1U) == 0) {
      do {
        iVar2 = (uint)*pbVar4 + (int)*psVar7;
        if (iVar2 < 1) {
          iVar2 = 0;
        }
        bVar1 = (byte)iVar2;
        if (0xfe < iVar2) {
          bVar1 = 0xff;
        }
        *pbVar5 = bVar1;
        lVar6 = lVar6 + -1;
        pbVar4 = pbVar4 + pred_strd;
        pbVar5 = pbVar5 + dst_strd;
        psVar7 = psVar7 + src_strd;
      } while (lVar6 != 0);
    }
    else {
      do {
        *pbVar5 = *pbVar4;
        lVar6 = lVar6 + -1;
        pbVar5 = pbVar5 + dst_strd;
        pbVar4 = pbVar4 + pred_strd;
      } while (lVar6 != 0);
    }
    pi2_src = pi2_src + 1;
    pu1_dst = pu1_dst + 2;
    pu1_pred = pu1_pred + 2;
    zero_cols = zero_cols >> 1;
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  return;
}

Assistant:

void ihevc_chroma_recon_4x4(WORD16 *pi2_src,
                            UWORD8 *pu1_pred,
                            UWORD8 *pu1_dst,
                            WORD32 src_strd,
                            WORD32 pred_strd,
                            WORD32 dst_strd,
                            WORD32 zero_cols)
{
    WORD32 i, j;
    WORD32 trans_size;

    trans_size = TRANS_SIZE_4;

    /* Reconstruction */

    for(i = 0; i < trans_size; i++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            for(j = 0; j < trans_size; j++)
            {
                pu1_dst[j * dst_strd] = pu1_pred[j * pred_strd];
            }
        }
        else
        {
            for(j = 0; j < trans_size; j++)
            {
                pu1_dst[j * dst_strd] =
                                CLIP_U8(pi2_src[j * src_strd] + pu1_pred[j * pred_strd]);
            }
        }
        pi2_src++;
        pu1_dst += 2;
        pu1_pred += 2;
        zero_cols = zero_cols >> 1;
    }
}